

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubGridIntersector1Pluecker<4,_true>_>::
     pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  ulong *puVar1;
  float fVar2;
  undefined4 uVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  Geometry *this;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 (*pauVar14) [16];
  bool bVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined1 (*local_1078) [16];
  long local_1070;
  long local_1068;
  ulong local_1060;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    bVar15 = false;
  }
  else {
    uStack_f70 = 0;
    fVar2 = (context->query_radius).field_0.m128[0];
    auVar53 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar55 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      auVar22 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar55 = ZEXT1664(auVar22);
    }
    local_1078 = (undefined1 (*) [16])local_f68;
    uVar3 = *(undefined4 *)&(query->p).field_0;
    local_f98._4_4_ = uVar3;
    local_f98._0_4_ = uVar3;
    local_f98._8_4_ = uVar3;
    local_f98._12_4_ = uVar3;
    auVar57 = ZEXT1664(local_f98);
    uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 4);
    local_fa8._4_4_ = uVar3;
    local_fa8._0_4_ = uVar3;
    local_fa8._8_4_ = uVar3;
    local_fa8._12_4_ = uVar3;
    auVar59 = ZEXT1664(local_fa8);
    uVar3 = *(undefined4 *)((long)&(query->p).field_0 + 8);
    local_fb8._4_4_ = uVar3;
    local_fb8._0_4_ = uVar3;
    local_fb8._8_4_ = uVar3;
    local_fb8._12_4_ = uVar3;
    auVar61 = ZEXT1664(local_fb8);
    local_1048 = (context->query_radius).field_0.m128[1];
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    local_1058 = (context->query_radius).field_0.m128[2];
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    local_f88 = vshufps_avx(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)(fVar2 * fVar2)),0);
    bVar15 = false;
    do {
      auVar56 = auVar57._0_16_;
      local_fe8 = vsubps_avx(auVar56,auVar53._0_16_);
      local_ff8 = auVar57._0_4_ + auVar53._0_4_;
      fStack_ff4 = auVar57._4_4_ + auVar53._4_4_;
      fStack_ff0 = auVar57._8_4_ + auVar53._8_4_;
      fStack_fec = auVar57._12_4_ + auVar53._12_4_;
      auVar60._4_4_ = fStack_1044;
      auVar60._0_4_ = local_1048;
      auVar60._8_4_ = fStack_1040;
      auVar60._12_4_ = fStack_103c;
      auVar58 = auVar59._0_16_;
      local_1008 = vsubps_avx(auVar58,auVar60);
      local_1018 = auVar59._0_4_ + local_1048;
      fStack_1014 = auVar59._4_4_ + fStack_1044;
      fStack_1010 = auVar59._8_4_ + fStack_1040;
      fStack_100c = auVar59._12_4_ + fStack_103c;
      auVar22._4_4_ = fStack_1054;
      auVar22._0_4_ = local_1058;
      auVar22._8_4_ = fStack_1050;
      auVar22._12_4_ = fStack_104c;
      auVar60 = auVar61._0_16_;
      local_1028 = vsubps_avx(auVar60,auVar22);
      local_1038 = auVar61._0_4_ + local_1058;
      fStack_1034 = auVar61._4_4_ + fStack_1054;
      fStack_1030 = auVar61._8_4_ + fStack_1050;
      fStack_102c = auVar61._12_4_ + fStack_104c;
      while (pauVar14 = local_1078 + -1, local_1078 = local_1078 + -1,
            *(float *)(*pauVar14 + 8) <= auVar55._0_4_) {
        uVar18 = *(ulong *)*local_1078;
LAB_011f3e5c:
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar18 & 8) != 0) {
LAB_011f416f:
            local_1070 = (ulong)((uint)uVar18 & 0xf) - 8;
            if (local_1070 != 0) {
              local_fd8 = auVar55._0_16_;
              local_fc8 = auVar53._0_16_;
              bVar20 = 0;
              local_1068 = 0;
              do {
                puVar1 = (ulong *)((uVar18 & 0xfffffffffffffff0) + 0x20 + local_1068 * 0x58);
                if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                  fVar2 = *(float *)(puVar1 + 3);
                  fVar4 = *(float *)((long)puVar1 + 0x24);
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = *puVar1;
                  auVar22 = vpmovzxbd_avx(auVar24);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar27._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar27._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar27._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar27._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = *(ulong *)((long)puVar1 + 4);
                  auVar22 = vpmovzxbd_avx(auVar32);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar35._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar35._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar35._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar35._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  fVar2 = *(float *)((long)puVar1 + 0x1c);
                  fVar4 = *(float *)(puVar1 + 5);
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = puVar1[1];
                  auVar22 = vpmovzxbd_avx(auVar44);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar45._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar45._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar45._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar45._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = *(ulong *)((long)puVar1 + 0xc);
                  auVar22 = vpmovzxbd_avx(auVar47);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar38._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar38._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar38._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar38._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  fVar2 = *(float *)(puVar1 + 4);
                  fVar4 = *(float *)((long)puVar1 + 0x2c);
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = puVar1[2];
                  auVar22 = vpmovzxbd_avx(auVar50);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar51._0_4_ = auVar22._0_4_ * fVar4 + fVar2;
                  auVar51._4_4_ = auVar22._4_4_ * fVar4 + fVar2;
                  auVar51._8_4_ = auVar22._8_4_ * fVar4 + fVar2;
                  auVar51._12_4_ = auVar22._12_4_ * fVar4 + fVar2;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = *(ulong *)((long)puVar1 + 0x14);
                  auVar22 = vpmovzxbd_avx(auVar54);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar41._0_4_ = fVar2 + auVar22._0_4_ * fVar4;
                  auVar41._4_4_ = fVar2 + auVar22._4_4_ * fVar4;
                  auVar41._8_4_ = fVar2 + auVar22._8_4_ * fVar4;
                  auVar41._12_4_ = fVar2 + auVar22._12_4_ * fVar4;
                  auVar22 = vmaxps_avx(auVar57._0_16_,auVar27);
                  auVar22 = vminps_avx(auVar22,auVar35);
                  auVar60 = vsubps_avx(auVar22,auVar57._0_16_);
                  auVar22 = vmaxps_avx(auVar59._0_16_,auVar45);
                  auVar22 = vminps_avx(auVar22,auVar38);
                  auVar56 = vsubps_avx(auVar22,auVar59._0_16_);
                  auVar22 = vmaxps_avx(auVar61._0_16_,auVar51);
                  auVar22 = vminps_avx(auVar22,auVar41);
                  auVar22 = vsubps_avx(auVar22,auVar61._0_16_);
                  auVar39._0_4_ =
                       auVar60._0_4_ * auVar60._0_4_ + auVar56._0_4_ * auVar56._0_4_ +
                       auVar22._0_4_ * auVar22._0_4_;
                  auVar39._4_4_ =
                       auVar60._4_4_ * auVar60._4_4_ + auVar56._4_4_ * auVar56._4_4_ +
                       auVar22._4_4_ * auVar22._4_4_;
                  auVar39._8_4_ =
                       auVar60._8_4_ * auVar60._8_4_ + auVar56._8_4_ * auVar56._8_4_ +
                       auVar22._8_4_ * auVar22._8_4_;
                  auVar39._12_4_ =
                       auVar60._12_4_ * auVar60._12_4_ + auVar56._12_4_ * auVar56._12_4_ +
                       auVar22._12_4_ * auVar22._12_4_;
                  auVar60 = vcmpps_avx(auVar39,local_f88,2);
                  auVar22 = vcmpps_avx(auVar27,auVar35,2);
                  auVar56 = vpminub_avx(auVar24,auVar32);
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = *puVar1;
                  auVar56 = vpcmpeqb_avx(auVar25,auVar56);
                  auVar56 = vpmovsxbd_avx(auVar56);
                  auVar22 = vandps_avx(auVar22,auVar56);
                  auVar22 = vandps_avx(auVar22,auVar60);
                }
                else {
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = *puVar1;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = *(ulong *)((long)puVar1 + 4);
                  auVar22 = vpminub_avx(auVar28,auVar33);
                  auVar22 = vpcmpeqb_avx(auVar28,auVar22);
                  auVar56 = vpmovsxbd_avx(auVar22);
                  fVar2 = *(float *)(puVar1 + 3);
                  fVar4 = *(float *)((long)puVar1 + 0x24);
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = *puVar1;
                  auVar22 = vpmovzxbd_avx(auVar29);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar30._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar30._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar30._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar30._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  auVar22 = vpmovzxbd_avx(auVar33);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar34._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar34._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar34._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar34._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  fVar2 = *(float *)((long)puVar1 + 0x1c);
                  fVar4 = *(float *)(puVar1 + 5);
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = puVar1[1];
                  auVar22 = vpmovzxbd_avx(auVar42);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar43._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar43._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar43._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar43._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = *(ulong *)((long)puVar1 + 0xc);
                  auVar22 = vpmovzxbd_avx(auVar46);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar36._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar36._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar36._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar36._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  fVar2 = *(float *)(puVar1 + 4);
                  fVar4 = *(float *)((long)puVar1 + 0x2c);
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = puVar1[2];
                  auVar22 = vpmovzxbd_avx(auVar48);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar49._0_4_ = fVar2 + fVar4 * auVar22._0_4_;
                  auVar49._4_4_ = fVar2 + fVar4 * auVar22._4_4_;
                  auVar49._8_4_ = fVar2 + fVar4 * auVar22._8_4_;
                  auVar49._12_4_ = fVar2 + fVar4 * auVar22._12_4_;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = *(ulong *)((long)puVar1 + 0x14);
                  auVar22 = vpmovzxbd_avx(auVar52);
                  auVar22 = vcvtdq2ps_avx(auVar22);
                  auVar40._0_4_ = fVar2 + auVar22._0_4_ * fVar4;
                  auVar40._4_4_ = fVar2 + auVar22._4_4_ * fVar4;
                  auVar40._8_4_ = fVar2 + auVar22._8_4_ * fVar4;
                  auVar40._12_4_ = fVar2 + auVar22._12_4_ * fVar4;
                  auVar22 = vcmpps_avx(auVar30,auVar34,2);
                  auVar60 = vcmpps_avx(auVar34,local_fe8,5);
                  auVar22 = vandps_avx(auVar60,auVar22);
                  auVar10._4_4_ = fStack_ff4;
                  auVar10._0_4_ = local_ff8;
                  auVar10._8_4_ = fStack_ff0;
                  auVar10._12_4_ = fStack_fec;
                  auVar60 = vcmpps_avx(auVar30,auVar10,2);
                  auVar60 = vandps_avx(auVar60,auVar56);
                  auVar22 = vandps_avx(auVar60,auVar22);
                  auVar60 = vcmpps_avx(auVar36,local_1008,5);
                  auVar56._4_4_ = fStack_1014;
                  auVar56._0_4_ = local_1018;
                  auVar56._8_4_ = fStack_1010;
                  auVar56._12_4_ = fStack_100c;
                  auVar56 = vcmpps_avx(auVar43,auVar56,2);
                  auVar60 = vandps_avx(auVar56,auVar60);
                  auVar56 = vcmpps_avx(auVar40,local_1028,5);
                  auVar58._4_4_ = fStack_1034;
                  auVar58._0_4_ = local_1038;
                  auVar58._8_4_ = fStack_1030;
                  auVar58._12_4_ = fStack_102c;
                  auVar58 = vcmpps_avx(auVar49,auVar58,2);
                  auVar60 = vandps_avx(auVar60,auVar58);
                  auVar22 = vandps_avx(auVar22,auVar60);
                  auVar22 = vandps_avx(auVar22,auVar56);
                }
                auVar22 = vpslld_avx(auVar22,0x1f);
                uVar17 = vmovmskps_avx(auVar22);
                if (uVar17 != 0) {
                  uVar19 = (ulong)(uVar17 & 0xff);
                  lVar21 = local_1068 * 0x58 + (uVar18 & 0xfffffffffffffff0);
                  do {
                    lVar9 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                      }
                    }
                    local_1060 = uVar19 - 1;
                    uVar17 = *(uint *)(lVar21 + 0x50);
                    uVar6 = *(uint *)(lVar21 + 4 + lVar9 * 8);
                    this = (context->scene->geometries).items[uVar17].ptr;
                    context->geomID = uVar17;
                    context->primID = uVar6;
                    bVar16 = Geometry::pointQuery(this,query,context);
                    bVar20 = bVar20 | bVar16;
                    uVar19 = uVar19 & local_1060;
                  } while (uVar19 != 0);
                }
                local_1068 = local_1068 + 1;
                auVar57 = ZEXT1664(local_f98);
                auVar59 = ZEXT1664(local_fa8);
                auVar61 = ZEXT1664(local_fb8);
              } while (local_1068 != local_1070);
              if (bVar20 == 0) {
                auVar53 = ZEXT1664(local_fc8);
                auVar55 = ZEXT1664(local_fd8);
              }
              else {
                uVar3 = *(undefined4 *)&(context->query_radius).field_0;
                auVar53 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
                local_1048 = (context->query_radius).field_0.m128[1];
                fStack_1044 = local_1048;
                fStack_1040 = local_1048;
                fStack_103c = local_1048;
                local_1058 = (context->query_radius).field_0.m128[2];
                fStack_1054 = local_1058;
                fStack_1050 = local_1058;
                fStack_104c = local_1058;
                if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                  auVar55 = ZEXT464((uint)(query->radius * query->radius));
                }
                else {
                  aVar5 = (context->query_radius).field_0;
                  auVar22 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
                  auVar55 = ZEXT1664(auVar22);
                }
                bVar15 = true;
              }
            }
            break;
          }
          auVar22 = vmaxps_avx(auVar56,*(undefined1 (*) [16])(uVar18 + 0x20));
          auVar10 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar18 + 0x30));
          auVar22 = vmaxps_avx(auVar58,*(undefined1 (*) [16])(uVar18 + 0x40));
          auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar18 + 0x50));
          auVar10 = vsubps_avx(auVar10,auVar56);
          auVar28 = vsubps_avx(auVar22,auVar58);
          auVar22 = vmaxps_avx(auVar60,*(undefined1 (*) [16])(uVar18 + 0x60));
          auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar18 + 0x70));
          auVar22 = vsubps_avx(auVar22,auVar60);
          local_1088._0_4_ =
               auVar10._0_4_ * auVar10._0_4_ + auVar28._0_4_ * auVar28._0_4_ +
               auVar22._0_4_ * auVar22._0_4_;
          local_1088._4_4_ =
               auVar10._4_4_ * auVar10._4_4_ + auVar28._4_4_ * auVar28._4_4_ +
               auVar22._4_4_ * auVar22._4_4_;
          fStack_1080 = auVar10._8_4_ * auVar10._8_4_ + auVar28._8_4_ * auVar28._8_4_ +
                        auVar22._8_4_ * auVar22._8_4_;
          fStack_107c = auVar10._12_4_ * auVar10._12_4_ + auVar28._12_4_ * auVar28._12_4_ +
                        auVar22._12_4_ * auVar22._12_4_;
          auVar22 = vcmpps_avx(_local_1088,local_f88,2);
          auVar10 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x20),
                               *(undefined1 (*) [16])(uVar18 + 0x30),2);
          auVar22 = vandps_avx(auVar22,auVar10);
        }
        else {
          if ((uVar18 & 8) != 0) goto LAB_011f416f;
          auVar22 = *(undefined1 (*) [16])(uVar18 + 0x20);
          auVar10 = *(undefined1 (*) [16])(uVar18 + 0x30);
          auVar28 = vmaxps_avx(auVar56,auVar22);
          auVar28 = vminps_avx(auVar28,auVar10);
          auVar12 = vsubps_avx(auVar28,auVar56);
          auVar28 = vmaxps_avx(auVar58,*(undefined1 (*) [16])(uVar18 + 0x40));
          auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar18 + 0x50));
          auVar11 = vsubps_avx(auVar28,auVar58);
          auVar28 = vmaxps_avx(auVar60,*(undefined1 (*) [16])(uVar18 + 0x60));
          auVar28 = vminps_avx(auVar28,*(undefined1 (*) [16])(uVar18 + 0x70));
          auVar28 = vsubps_avx(auVar28,auVar60);
          local_1088._4_4_ =
               auVar12._4_4_ * auVar12._4_4_ + auVar11._4_4_ * auVar11._4_4_ +
               auVar28._4_4_ * auVar28._4_4_;
          local_1088._0_4_ =
               auVar12._0_4_ * auVar12._0_4_ + auVar11._0_4_ * auVar11._0_4_ +
               auVar28._0_4_ * auVar28._0_4_;
          fStack_1080 = auVar12._8_4_ * auVar12._8_4_ + auVar11._8_4_ * auVar11._8_4_ +
                        auVar28._8_4_ * auVar28._8_4_;
          fStack_107c = auVar12._12_4_ * auVar12._12_4_ + auVar11._12_4_ * auVar11._12_4_ +
                        auVar28._12_4_ * auVar28._12_4_;
          auVar28 = vcmpps_avx(auVar22,auVar10,2);
          auVar12 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x50),local_1008,5);
          auVar28 = vandps_avx(auVar28,auVar12);
          auVar13._4_4_ = fStack_ff4;
          auVar13._0_4_ = local_ff8;
          auVar13._8_4_ = fStack_ff0;
          auVar13._12_4_ = fStack_fec;
          auVar22 = vcmpps_avx(auVar22,auVar13,2);
          auVar11._4_4_ = fStack_1014;
          auVar11._0_4_ = local_1018;
          auVar11._8_4_ = fStack_1010;
          auVar11._12_4_ = fStack_100c;
          auVar12 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x40),auVar11,2);
          auVar22 = vandps_avx(auVar12,auVar22);
          auVar12 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x70),local_1028,5);
          auVar28 = vandps_avx(auVar28,auVar12);
          auVar10 = vcmpps_avx(auVar10,local_fe8,5);
          auVar12._4_4_ = fStack_1034;
          auVar12._0_4_ = local_1038;
          auVar12._8_4_ = fStack_1030;
          auVar12._12_4_ = fStack_102c;
          auVar12 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x60),auVar12,2);
          auVar10 = vandps_avx(auVar12,auVar10);
          auVar22 = vandps_avx(auVar22,auVar10);
          auVar22 = vandps_avx(auVar22,auVar28);
        }
        auVar22 = vpslld_avx(auVar22,0x1f);
        uVar17 = vmovmskps_avx(auVar22);
        if (uVar17 != 0) {
          uVar17 = uVar17 & 0xff;
          uVar19 = uVar18 & 0xfffffffffffffff0;
          lVar21 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar18 = *(ulong *)(uVar19 + lVar21 * 8);
          uVar17 = uVar17 - 1 & uVar17;
          if (uVar17 != 0) {
            uVar6 = *(uint *)(local_1088 + lVar21 * 4);
            lVar21 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar8 = *(ulong *)(uVar19 + lVar21 * 8);
            uVar7 = *(uint *)(local_1088 + lVar21 * 4);
            uVar17 = uVar17 - 1 & uVar17;
            if (uVar17 == 0) {
              if (uVar6 < uVar7) {
                *(ulong *)*local_1078 = uVar8;
                *(uint *)(*local_1078 + 8) = uVar7;
                local_1078 = local_1078 + 1;
              }
              else {
                *(ulong *)*local_1078 = uVar18;
                *(uint *)(*local_1078 + 8) = uVar6;
                local_1078 = local_1078 + 1;
                uVar18 = uVar8;
              }
            }
            else {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = uVar18;
              auVar22 = vpunpcklqdq_avx(auVar23,ZEXT416(uVar6));
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar8;
              auVar10 = vpunpcklqdq_avx(auVar26,ZEXT416(uVar7));
              lVar21 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(uVar19 + lVar21 * 8);
              auVar12 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_1088 + lVar21 * 4)));
              auVar28 = vpcmpgtd_avx(auVar10,auVar22);
              uVar17 = uVar17 - 1 & uVar17;
              if (uVar17 == 0) {
                auVar11 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar10,auVar22,auVar11);
                auVar22 = vblendvps_avx(auVar22,auVar10,auVar11);
                auVar10 = vpcmpgtd_avx(auVar12,auVar28);
                auVar11 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar12,auVar28,auVar11);
                auVar28 = vblendvps_avx(auVar28,auVar12,auVar11);
                auVar12 = vpcmpgtd_avx(auVar28,auVar22);
                auVar11 = vpshufd_avx(auVar12,0xaa);
                auVar12 = vblendvps_avx(auVar28,auVar22,auVar11);
                auVar22 = vblendvps_avx(auVar22,auVar28,auVar11);
                *local_1078 = auVar22;
                local_1078[1] = auVar12;
                uVar18 = auVar10._0_8_;
                local_1078 = local_1078 + 2;
              }
              else {
                lVar21 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)(uVar19 + lVar21 * 8);
                auVar13 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_1088 + lVar21 * 4)));
                auVar11 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar10,auVar22,auVar11);
                auVar22 = vblendvps_avx(auVar22,auVar10,auVar11);
                auVar10 = vpcmpgtd_avx(auVar13,auVar12);
                auVar11 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar13,auVar12,auVar11);
                auVar12 = vblendvps_avx(auVar12,auVar13,auVar11);
                auVar11 = vpcmpgtd_avx(auVar12,auVar22);
                auVar13 = vpshufd_avx(auVar11,0xaa);
                auVar11 = vblendvps_avx(auVar12,auVar22,auVar13);
                auVar22 = vblendvps_avx(auVar22,auVar12,auVar13);
                auVar12 = vpcmpgtd_avx(auVar10,auVar28);
                auVar13 = vpshufd_avx(auVar12,0xaa);
                auVar12 = vblendvps_avx(auVar10,auVar28,auVar13);
                auVar10 = vblendvps_avx(auVar28,auVar10,auVar13);
                auVar28 = vpcmpgtd_avx(auVar11,auVar10);
                auVar13 = vpshufd_avx(auVar28,0xaa);
                auVar28 = vblendvps_avx(auVar11,auVar10,auVar13);
                auVar10 = vblendvps_avx(auVar10,auVar11,auVar13);
                *local_1078 = auVar22;
                local_1078[1] = auVar10;
                local_1078[2] = auVar28;
                uVar18 = auVar12._0_8_;
                local_1078 = local_1078 + 3;
              }
            }
          }
          goto LAB_011f3e5c;
        }
        if (local_1078 == (undefined1 (*) [16])&local_f78) {
          return bVar15;
        }
      }
      local_f88._0_4_ = auVar53._0_4_ * auVar53._0_4_;
      local_f88._4_4_ = auVar53._4_4_ * auVar53._4_4_;
      local_f88._8_4_ = auVar53._8_4_ * auVar53._8_4_;
      local_f88._12_4_ = auVar53._12_4_ * auVar53._12_4_;
    } while (local_1078 != (undefined1 (*) [16])&local_f78);
  }
  return bVar15;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }